

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O0

int Extra_ThreshAssignWeights
              (word *t,char *pIsop,char *pIsopFneg,int nVars,int *pW,int *pChow,int nChows,int Wmin)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int nInequalities_00;
  int iVar4;
  int iVar5;
  int iVar6;
  int *pWofChow_00;
  size_t sVar7;
  unsigned_long **pGreaters_00;
  unsigned_long *puVar8;
  unsigned_long **pSmallers_00;
  unsigned_long **pSmallers;
  unsigned_long **pGreaters;
  int nInequalities;
  int nCubesIsopFneg;
  int nCubesIsop;
  int *pWofChow;
  int fIncremented;
  int deltaOld;
  int delta;
  int Limit;
  int Lmax;
  int Lmin;
  int j;
  int i;
  int *pChow_local;
  int *pW_local;
  int nVars_local;
  char *pIsopFneg_local;
  char *pIsop_local;
  word *t_local;
  
  pWofChow._4_4_ = -1000;
  bVar2 = false;
  pWofChow_00 = (int *)malloc((long)nChows << 2);
  sVar7 = strlen(pIsop);
  iVar6 = (int)(sVar7 / (ulong)(long)(nVars + 3));
  sVar7 = strlen(pIsopFneg);
  iVar3 = (int)(sVar7 / (ulong)(long)(nVars + 3));
  nInequalities_00 = iVar6 * iVar3;
  pGreaters_00 = (unsigned_long **)malloc((long)(iVar6 * iVar3) << 3);
  for (Lmin = 0; Lmin < iVar6 * iVar3; Lmin = Lmin + 1) {
    puVar8 = (unsigned_long *)malloc((long)nChows << 3);
    pGreaters_00[Lmin] = puVar8;
  }
  pSmallers_00 = (unsigned_long **)malloc((long)(iVar6 * iVar3) << 3);
  for (Lmin = 0; Lmin < iVar6 * iVar3; Lmin = Lmin + 1) {
    puVar8 = (unsigned_long *)malloc((long)nChows << 3);
    pSmallers_00[Lmin] = puVar8;
  }
  Extra_ThreshCreateInequalities
            (pIsop,pIsopFneg,nVars,pWofChow_00,pChow,nChows,nInequalities_00,pGreaters_00,
             pSmallers_00);
  Extra_ThreshSimplifyInequalities(nInequalities_00,nChows,pGreaters_00,pSmallers_00);
  *pWofChow_00 = Wmin;
  for (Lmin = 1; Lmin < nChows; Lmin = Lmin + 1) {
    pWofChow_00[Lmin] = pWofChow_00[Lmin + -1] + 1;
  }
  Lmin = 0;
  while( true ) {
    Lmax = 0;
    bVar1 = false;
    if (Lmin < nChows) {
      bVar1 = pWofChow_00[nChows + -1] <= nVars << 1;
    }
    if (!bVar1) break;
    while (Lmax < nInequalities_00) {
      if (pGreaters_00[Lmax][Lmin] == 0) {
        Lmax = Lmax + 1;
      }
      else {
        iVar4 = Extra_ThreshCubeWeightedSum3(pWofChow_00,nChows,pGreaters_00,Lmax);
        iVar5 = Extra_ThreshCubeWeightedSum4(pWofChow_00,nChows,pSmallers_00,Lmax);
        iVar4 = iVar4 - iVar5;
        if (iVar4 < 1) {
          if (pWofChow._4_4_ < iVar4) {
            Extra_ThreshIncrementWeights(nChows,pWofChow_00,Lmin);
            bVar2 = true;
            pWofChow._4_4_ = iVar4;
          }
          else if (bVar2) {
            Extra_ThreshDecrementWeights(nChows,pWofChow_00,Lmin);
            Lmax = Lmax + 1;
            pWofChow._4_4_ = -1000;
            bVar2 = false;
          }
          else {
            Lmax = Lmax + 1;
          }
        }
        else if (bVar2) {
          Lmax = 0;
          bVar2 = false;
          pWofChow._4_4_ = -1000;
        }
        else {
          Lmax = Lmax + 1;
        }
      }
    }
    Lmin = Lmin + 1;
  }
  for (Lmin = 0; Lmin < iVar6 * iVar3; Lmin = Lmin + 1) {
    free(pGreaters_00[Lmin]);
  }
  free(pGreaters_00);
  for (Lmin = 0; Lmin < iVar6 * iVar3; Lmin = Lmin + 1) {
    free(pSmallers_00[Lmin]);
  }
  free(pSmallers_00);
  Limit = 1000;
  delta = 0;
  for (Lmax = 0; sVar7 = strlen(pIsop), Lmax < (int)sVar7; Lmax = nVars + 3 + Lmax) {
    iVar6 = Extra_ThreshCubeWeightedSum1(pWofChow_00,pChow,pIsop,nVars,Lmax);
    Limit = Abc_MinInt(Limit,iVar6);
  }
  for (Lmax = 0; sVar7 = strlen(pIsopFneg), Lmax < (int)sVar7; Lmax = nVars + 3 + Lmax) {
    iVar6 = Extra_ThreshCubeWeightedSum2(pWofChow_00,pChow,pIsopFneg,nVars,Lmax);
    delta = Abc_MaxInt(delta,iVar6);
  }
  for (Lmin = 0; Lmin < nVars; Lmin = Lmin + 1) {
    pW[Lmin] = pWofChow_00[pChow[Lmin]];
  }
  if (pWofChow_00 != (int *)0x0) {
    free(pWofChow_00);
  }
  if (delta < Limit) {
    t_local._4_4_ = Limit;
  }
  else {
    t_local._4_4_ = 0;
  }
  return t_local._4_4_;
}

Assistant:

int Extra_ThreshAssignWeights(word * t, char * pIsop, char * pIsopFneg,
		int nVars, int * pW, int * pChow, int nChows, int Wmin) {

	int i = 0, j = 0, Lmin = 1000, Lmax = 0, Limit = nVars * 2, delta = 0,
			deltaOld = -1000, fIncremented = 0;
	//******************************
	int * pWofChow = ABC_ALLOC( int, nChows );
	int nCubesIsop = strlen(pIsop) / (nVars + 3);
	int nCubesIsopFneg = strlen(pIsopFneg) / (nVars + 3);
	int nInequalities = nCubesIsop * nCubesIsopFneg;
	unsigned long **pGreaters;
	unsigned long **pSmallers;

	pGreaters = (unsigned long **)malloc(nCubesIsop * nCubesIsopFneg * sizeof *pGreaters);
	for (i = 0; i < nCubesIsop * nCubesIsopFneg; i++) {
		pGreaters[i] = (unsigned long *)malloc(nChows * sizeof *pGreaters[i]);
	}
	pSmallers = (unsigned long **)malloc(nCubesIsop * nCubesIsopFneg * sizeof *pSmallers);
	for (i = 0; i < nCubesIsop * nCubesIsopFneg; i++) {
		pSmallers[i] = (unsigned long *)malloc(nChows * sizeof *pSmallers[i]);
	}

	//******************************
	Extra_ThreshCreateInequalities(pIsop, pIsopFneg, nVars, pWofChow, pChow,
			nChows, nInequalities, pGreaters, pSmallers);
	Extra_ThreshSimplifyInequalities(nInequalities, nChows, pGreaters,
			pSmallers);

	//initializes the weights
	pWofChow[0] = Wmin;
	for (i = 1; i < nChows; i++) {
		pWofChow[i] = pWofChow[i - 1] + 1;
	}
	i = 0;

	//assign the weights respecting the inequalities
	while (i < nChows && pWofChow[nChows - 1] <= Limit) {
		Lmin = 1000;
		Lmax = 0;

		while (j < nInequalities) {
			if (pGreaters[j][i] != 0) {
				Lmin = Extra_ThreshCubeWeightedSum3(pWofChow, nChows, pGreaters,
						j);
				Lmax = Extra_ThreshCubeWeightedSum4(pWofChow, nChows, pSmallers,
						j);
				delta = Lmin - Lmax;

				if (delta > 0) {
					if (fIncremented == 1) {
						j = 0;
						fIncremented = 0;
						deltaOld = -1000;
					} else
						j++;
					continue;
				}
				if (delta > deltaOld) {
					Extra_ThreshIncrementWeights(nChows, pWofChow, i);
					deltaOld = delta;
					fIncremented = 1;
				} else if (fIncremented == 1) {
					Extra_ThreshDecrementWeights(nChows, pWofChow, i);
					j++;
					deltaOld = -1000;
					fIncremented = 0;
					continue;
				} else
					j++;
			} else
				j++;

		}
		i++;
		j = 0;
	}

	//******************************
	for (i = 0; i < nCubesIsop * nCubesIsopFneg; i++) {
		free(pGreaters[i]);
	}
	free(pGreaters);
	for (i = 0; i < nCubesIsop * nCubesIsopFneg; i++) {
		free(pSmallers[i]);
	}
	free(pSmallers);
	//******************************

	i = 0;
	Lmin = 1000;
	Lmax = 0;

	//check the assigned weights in the original system
	for (j = 0; j < (int)strlen(pIsop); j += (nVars + 3))
		Lmin = Abc_MinInt(Lmin,
				Extra_ThreshCubeWeightedSum1(pWofChow, pChow, pIsop, nVars, j));
	for (j = 0; j < (int)strlen(pIsopFneg); j += (nVars + 3))
		Lmax = Abc_MaxInt(Lmax,
				Extra_ThreshCubeWeightedSum2(pWofChow, pChow, pIsopFneg, nVars,
						j));

	for (i = 0; i < nVars; i++) {
		pW[i] = pWofChow[pChow[i]];
	}

    ABC_FREE( pWofChow );
	if (Lmin > Lmax)
		return Lmin;
	else
		return 0;
}